

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::remove_node(xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct **ppxVar4;
  xml_node_struct *pxVar5;
  
  pxVar1 = node->parent;
  pxVar2 = node->prev_sibling_c;
  pxVar3 = node->next_sibling;
  pxVar5 = pxVar3;
  if (pxVar3 == (xml_node_struct *)0x0) {
    pxVar5 = pxVar1->first_child;
  }
  pxVar5->prev_sibling_c = pxVar2;
  ppxVar4 = &pxVar1->first_child;
  if (pxVar2->next_sibling != (xml_node_struct *)0x0) {
    ppxVar4 = &pxVar2->next_sibling;
  }
  *ppxVar4 = pxVar3;
  node->parent = (xml_node_struct *)0x0;
  node->prev_sibling_c = (xml_node_struct *)0x0;
  node->next_sibling = (xml_node_struct *)0x0;
  return;
}

Assistant:

inline void remove_node(xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		xml_node_struct* next = node->next_sibling;
		xml_node_struct* prev = node->prev_sibling_c;

		if (next)
			next->prev_sibling_c = prev;
		else
			parent->first_child->prev_sibling_c = prev;

		if (prev->next_sibling)
			prev->next_sibling = next;
		else
			parent->first_child = next;

		node->parent = NULL;
		node->prev_sibling_c = NULL;
		node->next_sibling = NULL;
	}